

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O0

vector<float,_pstd::pmr::polymorphic_allocator<float>_> * __thiscall
pbrt::NanoVDBMediumProvider::GetMaxDensityGrid
          (NanoVDBMediumProvider *this,Allocator alloc,Point3i *res)

{
  anon_class_24_3_a25db8d5 *__f;
  int *in_RCX;
  undefined8 in_RDX;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_RSI;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_RDI;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *maxGrid;
  undefined8 in_stack_ffffffffffffff48;
  Point3<int> *in_stack_ffffffffffffff50;
  polymorphic_allocator<float> *in_stack_ffffffffffffff58;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *count;
  int64_t in_stack_ffffffffffffffa0;
  polymorphic_allocator<float> local_40;
  undefined4 local_34;
  undefined1 local_2d;
  undefined4 local_2c;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int line;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *file;
  LogLevel level;
  
  level = (LogLevel)((ulong)in_RDX >> 0x20);
  count = in_RDI;
  file = in_RSI;
  Point3<int>::Point3(in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                      (int)in_stack_ffffffffffffff48,0);
  *(ulong *)in_RCX = CONCAT44(in_stack_ffffffffffffffd8,local_2c);
  in_RCX[2] = in_stack_ffffffffffffffdc;
  if (LOGGING_LogLevel < 1) {
    Log(level,(char *)file,(int)((ulong)in_RCX >> 0x20),
        (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  local_2d = 0;
  local_34 = 0;
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator<std::byte>
            (&local_40,(polymorphic_allocator<std::byte> *)(long)(*in_RCX * in_RCX[1] * in_RCX[2]));
  line = (int)((ulong)in_RCX >> 0x20);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (in_RSI,(size_t)count,(float *)in_RDI,in_stack_ffffffffffffff58);
  __f = (anon_class_24_3_a25db8d5 *)
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size(in_RDI);
  std::function<void(long)>::
  function<pbrt::NanoVDBMediumProvider::GetMaxDensityGrid(pstd::pmr::polymorphic_allocator<std::byte>,pbrt::Point3<int>*)const::_lambda(unsigned_long)_1_,void>
            ((function<void_(long)> *)in_RDI,__f);
  ParallelFor(in_stack_ffffffffffffffa0,(int64_t)in_RDI,(function<void_(long)> *)in_RSI);
  std::function<void_(long)>::~function((function<void_(long)> *)0x66d4af);
  if (LOGGING_LogLevel < 1) {
    Log(level,(char *)file,line,
        (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  return count;
}

Assistant:

pstd::vector<Float> GetMaxDensityGrid(Allocator alloc, Point3i *res) const {
#if 0
    // For debugging: single, medium-wide majorant...
    *res = Point3i(1, 1, 1);
    Float minDensity, maxDensity;
    densityFloatGrid->tree().extrema(minDensity, maxDensity);
    return pstd::vector<Float>(1, maxDensity, alloc);
#else
        *res = Point3i(64, 64, 64);

        LOG_VERBOSE("Starting nanovdb grid GetMaxDensityGrid()");

        pstd::vector<Float> maxGrid(res->x * res->y * res->z, 0.f, alloc);

        ParallelFor(0, maxGrid.size(), [&](size_t index) {
            // Indices into maxGrid
            int x = index % res->x;
            int y = (index / res->x) % res->y;
            int z = index / (res->x * res->y);
            CHECK_EQ(index, x + res->x * (y + res->y * z));

            // World (aka medium) space bounds of this max grid cell
            Bounds3f wb(bounds.Lerp(Point3f(Float(x) / res->x, Float(y) / res->y,
                                            Float(z) / res->z)),
                        bounds.Lerp(Point3f(Float(x + 1) / res->x, Float(y + 1) / res->y,
                                            Float(z + 1) / res->z)));

            // Compute corresponding NanoVDB index-space bounds in floating-point.
            nanovdb::Vec3R i0 = densityFloatGrid->worldToIndexF(
                nanovdb::Vec3R(wb.pMin.x, wb.pMin.y, wb.pMin.z));
            nanovdb::Vec3R i1 = densityFloatGrid->worldToIndexF(
                nanovdb::Vec3R(wb.pMax.x, wb.pMax.y, wb.pMax.z));

            // Now find integer index-space bounds, accounting for both
            // filtering and the overall index bounding box.
            auto bbox = densityFloatGrid->indexBBox();
            Float delta = 1.f;  // Filter slop
            int nx0 = std::max(int(i0[0] - delta), bbox.min()[0]);
            int nx1 = std::min(int(i1[0] + delta), bbox.max()[0]);
            int ny0 = std::max(int(i0[1] - delta), bbox.min()[1]);
            int ny1 = std::min(int(i1[1] + delta), bbox.max()[1]);
            int nz0 = std::max(int(i0[2] - delta), bbox.min()[2]);
            int nz1 = std::min(int(i1[2] + delta), bbox.max()[2]);

            Float maxValue = 0;
            auto accessor = densityFloatGrid->getAccessor();
            // Apparently nanovdb integer bounding boxes are inclusive on
            // the upper end...
            for (int nz = nz0; nz <= nz1; ++nz)
                for (int ny = ny0; ny <= ny1; ++ny)
                    for (int nx = nx0; nx <= nx1; ++nx)
                        maxValue = std::max(maxValue, accessor.getValue({nx, ny, nz}));

            // Only write into maxGrid once when we're done to minimize
            // cache thrashing..
            maxGrid[index] = maxValue;
        });

        LOG_VERBOSE("Finished nanovdb grid GetMaxDensityGrid()");
        return maxGrid;
#endif
    }